

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_threading.hpp
# Opt level: O3

unordered_map<const_void_*,_std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>_>_>
* chaiscript::detail::threading::
  Thread_Storage<std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>
  ::t(void)

{
  long *in_FS_OFFSET;
  
  if ((char)in_FS_OFFSET[-1] == '\0') {
    Thread_Storage<std::set<std::type_info_const*,chaiscript::Type_Conversions::Less_Than,std::allocator<std::type_info_const*>>>
    ::t();
  }
  return (unordered_map<const_void_*,_std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>_>_>
          *)(*in_FS_OFFSET + -0x40);
}

Assistant:

static std::unordered_map<const void *, T> &t() noexcept {
      static thread_local std::unordered_map<const void *, T> my_t;
      return my_t;
    }